

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtx_lock.c
# Opt level: O1

int main(void)

{
  return 0;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    TESTCASE( mtx_init( &g_mutex, mtx_plain ) == thrd_success );

    for ( unsigned i = 0; i < COUNT; ++i )
    {
        TESTCASE( thrd_create( &g_thread[i], func, NULL ) == thrd_success );
    }

    for ( unsigned i = 0; i < COUNT; ++i )
    {
        TESTCASE( thrd_join( g_thread[i], NULL ) == thrd_success );
    }

#endif
    return TEST_RESULTS;
}